

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
::
ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::ConHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
           *this,int info)

{
  int num_items;
  int iVar1;
  int iVar2;
  StringRef name;
  IntSuffixHandler suffix_handler;
  SuffixHandler<double> local_28;
  
  iVar2 = *(int *)(*(long *)(this + 8) + 4);
  iVar1 = *(int *)(*(long *)(this + 8) + 0x14);
  num_items = iVar1 + iVar2;
  iVar2 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          ::ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      *)this,1,iVar1 + iVar2 + 1);
  name = BinaryReader<mp::internal::IdentityConverter>::ReadString
                   (*(BinaryReader<mp::internal::IdentityConverter> **)this);
  if ((info & 4U) == 0) {
    local_28.suffix_.super_BasicSuffix<double>.super_SuffixBase.impl_ =
         (BasicMutSuffix<double>)
         BasicProblem<mp::BasicProblemParams<int>_>::AddSuffix<int>
                   (*(BasicProblem<mp::BasicProblemParams<int>_> **)(*(long *)(this + 0x10) + 8),
                    name,info & 3U);
    ReadSuffixValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::IntReader,mp::BasicProblem<mp::BasicProblemParams<int>>::SuffixHandler<int>>
              (this,iVar2,num_items,(SuffixHandler<int> *)&local_28);
  }
  else {
    local_28 = BasicProblem<mp::BasicProblemParams<int>_>::AddSuffix<double>
                         (*(BasicProblem<mp::BasicProblemParams<int>_> **)
                           (*(long *)(this + 0x10) + 8),name,info & 3U);
    ReadSuffixValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::DoubleReader,mp::BasicProblem<mp::BasicProblemParams<int>>::SuffixHandler<double>>
              (this,iVar2,num_items,&local_28);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadSuffix(int info) {
  int num_items = ItemInfo(*this).num_items();
  int num_values = ReadUInt(1, num_items + 1);
  fmt::StringRef name = reader_.ReadName();
  reader_.ReadTillEndOfLine();
  suf::Kind kind = static_cast<suf::Kind>(info & internal::SUFFIX_KIND_MASK);
  if ((info & suf::FLOAT) != 0) {
    typename Handler::DblSuffixHandler
        suffix_handler = handler_.OnDblSuffix(name, kind, num_values);
    ReadSuffixValues<DoubleReader>(num_values, num_items, suffix_handler);
  } else {
    typename Handler::IntSuffixHandler
        suffix_handler = handler_.OnIntSuffix(name, kind, num_values);
    ReadSuffixValues<IntReader>(num_values, num_items, suffix_handler);
  }
}